

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedType<unsigned_char>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedType<unsigned_char> min,WrappedType<unsigned_char> max,float gridSize)

{
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  WrappedType<unsigned_char> WVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  long lVar11;
  char cVar12;
  byte bVar13;
  uint uVar14;
  byte bVar15;
  char cVar16;
  ushort uVar17;
  ulong uVar18;
  char cVar19;
  uint uVar20;
  float fVar21;
  deRandom rnd;
  uint local_a8;
  deRandom local_90;
  ulong local_80;
  int local_78;
  int local_74;
  char *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  char *local_40;
  ulong local_38;
  
  uVar18 = (ulong)(uint)stride;
  if (stride == 0) {
    uVar18 = (ulong)(uint)componentCount;
  }
  iVar1 = (int)uVar18;
  local_38 = (ulong)(uint)(iVar1 * 2);
  iVar5 = iVar1 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar5 = 0;
  }
  local_70 = (char *)operator_new__((long)(iVar5 * count + offset));
  deRandom_init(&local_90,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar21 = (float)max.m_value - (float)min.m_value;
    uVar20 = -(uint)(-fVar21 <= fVar21);
    uVar6 = (uint)((float)(~uVar20 & (uint)-fVar21 | (uint)fVar21 & uVar20) * gridSize);
    uVar20 = 8;
    if (8 < (byte)uVar6) {
      uVar20 = uVar6;
    }
    if (0 < count) {
      local_40 = local_70 + offset;
      uVar6 = (uint)max.m_value - (uint)min.m_value;
      uVar14 = uVar20 & 0xff;
      local_48 = (ulong)(uint)(iVar1 * 3);
      local_50 = (ulong)(uint)(iVar1 * 4);
      local_58 = (ulong)(uint)(iVar1 * 5);
      local_74 = 2;
      local_78 = 3;
      local_80 = 0;
      local_68 = uVar18;
      local_60 = (ulong)(uint)count;
      do {
        local_a8 = 0;
        while( true ) {
          WVar7.m_value = min.m_value;
          if (min.m_value < max.m_value) {
            dVar2 = deRandom_getUint32(&local_90);
            WVar7.m_value = (char)(dVar2 % uVar6) + min.m_value;
          }
          bVar13 = (byte)uVar20;
          cVar4 = WVar7.m_value - WVar7.m_value % bVar13;
          uVar17 = (ushort)uVar20;
          if (bVar13 < (byte)(max.m_value - cVar4)) {
            dVar2 = deRandom_getUint32(&local_90);
            uVar17 = (ushort)(byte)((char)(dVar2 % ((byte)(max.m_value - cVar4) - uVar14)) + bVar13)
            ;
          }
          WVar7.m_value = min.m_value;
          if (min.m_value < max.m_value) {
            dVar2 = deRandom_getUint32(&local_90);
            WVar7.m_value = (char)(dVar2 % uVar6) + min.m_value;
          }
          cVar19 = WVar7.m_value - WVar7.m_value % bVar13;
          bVar8 = bVar13;
          if (bVar13 < (byte)(max.m_value - cVar19)) {
            dVar2 = deRandom_getUint32(&local_90);
            bVar8 = (char)(dVar2 % ((byte)(max.m_value - cVar19) - uVar14)) + bVar13;
          }
          bVar15 = (char)uVar17 - (char)((uVar17 & 0xff) % (ushort)bVar13);
          bVar8 = bVar8 - bVar8 % bVar13;
          if (componentCount < 3) break;
          if (min.m_value < max.m_value) {
            dVar2 = deRandom_getUint32(&local_90);
            bVar9 = (char)(dVar2 % uVar6) + min.m_value;
            bVar9 = bVar9 - bVar9 % bVar13;
            bVar10 = 1;
            if (componentCount != 3) {
              dVar2 = deRandom_getUint32(&local_90);
              bVar10 = (char)(dVar2 % uVar6) + min.m_value;
              bVar10 = bVar10 - bVar10 % bVar13;
            }
          }
          else {
            bVar9 = min.m_value - min.m_value % bVar13;
            bVar10 = bVar9;
            if (componentCount == 3) {
              bVar10 = 1;
            }
          }
          if ((((ushort)uVar14 <= (ushort)((ushort)bVar9 + (ushort)bVar15)) &&
              ((ushort)uVar14 <= (ushort)((ushort)bVar10 + (ushort)bVar8))) || (2 < local_a8))
          goto LAB_009444f3;
          local_a8 = local_a8 + 1;
        }
        bVar9 = 0;
        bVar10 = 1;
LAB_009444f3:
        iVar3 = iVar5 * (int)local_80;
        iVar1 = (int)local_68;
        cVar16 = bVar15 + cVar4;
        local_40[iVar3] = cVar4;
        local_40[(long)iVar3 + 1] = cVar19;
        local_40[iVar3 + iVar1] = cVar16;
        local_40[iVar3 + 1 + iVar1] = cVar19;
        cVar12 = bVar8 + cVar19;
        lVar11 = (long)((int)local_38 + iVar3);
        local_40[lVar11] = cVar4;
        local_40[lVar11 + 1] = cVar12;
        local_40[iVar3 + (int)local_48] = cVar4;
        local_40[iVar3 + 1 + (int)local_48] = cVar12;
        lVar11 = (long)(iVar3 + (int)local_50);
        local_40[lVar11] = cVar16;
        local_40[lVar11 + 1] = cVar19;
        local_40[iVar3 + (int)local_58] = cVar16;
        local_40[iVar3 + (int)local_58 + 1] = cVar12;
        if (2 < componentCount) {
          lVar11 = 6;
          iVar3 = local_74;
          do {
            local_40[iVar3] = bVar9;
            iVar3 = iVar3 + iVar1;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
          if (componentCount != 3) {
            lVar11 = 6;
            iVar3 = local_78;
            do {
              local_40[iVar3] = bVar10;
              iVar3 = iVar3 + iVar1;
              lVar11 = lVar11 + -1;
            } while (lVar11 != 0);
          }
        }
        local_80 = local_80 + 1;
        local_74 = local_74 + iVar5;
        local_78 = local_78 + iVar5;
      } while (local_80 != local_60);
    }
  }
  return local_70;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}